

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

char * ImParseFormatTrimDecorations(char *fmt,char *buf,size_t buf_size)

{
  char cVar1;
  char *pcVar2;
  char *count;
  char *in_RCX;
  int iVar3;
  char *fmt_00;
  
  fmt_00 = fmt;
  do {
    cVar1 = *fmt_00;
    if (cVar1 == '\0') {
      iVar3 = 3;
      pcVar2 = in_RCX;
    }
    else if ((cVar1 != '%') || (iVar3 = 1, pcVar2 = fmt_00, fmt_00[1] == '%')) {
      fmt_00 = fmt_00 + (ulong)(cVar1 == '%') + 1;
      iVar3 = 0;
      pcVar2 = in_RCX;
    }
    in_RCX = pcVar2;
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    fmt_00 = pcVar2;
  }
  if ((*fmt_00 == '%') && (pcVar2 = ImParseFormatFindEnd(fmt_00), fmt = fmt_00, *pcVar2 != '\0')) {
    count = pcVar2 + (1 - (long)fmt_00);
    if (buf_size <= pcVar2 + (1 - (long)fmt_00)) {
      count = (char *)buf_size;
    }
    ImStrncpy(buf,fmt_00,(size_t)count);
    fmt = buf;
  }
  return fmt;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, size_t buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((size_t)(fmt_end - fmt_start) + 1, buf_size));
    return buf;
}